

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O2

void qt_rectfill<unsigned_char>
               (uchar *dest,uchar value,int x,int y,int width,int height,qsizetype stride)

{
  quint8 *dest_00;
  int iVar1;
  
  dest_00 = dest + y * stride + (long)x;
  if ((stride & 0xffffffffU) != (long)width) {
    iVar1 = 0;
    if (0 < height) {
      iVar1 = height;
    }
    while (iVar1 != 0) {
      qt_memfill<unsigned_char>(dest_00,value,(long)width);
      dest_00 = dest_00 + stride;
      iVar1 = iVar1 + -1;
    }
    return;
  }
  qt_memfill<unsigned_char>(dest_00,value,(stride & 0xffffffffU) * (long)height);
  return;
}

Assistant:

static
inline void qt_rectfill(T *dest, T value,
                        int x, int y, int width, int height, qsizetype stride)
{
    char *d = reinterpret_cast<char*>(dest + x) + y * stride;
    if (uint(stride) == (width * sizeof(T))) {
        qt_memfill(reinterpret_cast<T*>(d), value, qsizetype(width) * height);
    } else {
        for (int j = 0; j < height; ++j) {
            dest = reinterpret_cast<T*>(d);
            qt_memfill(dest, value, width);
            d += stride;
        }
    }
}